

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trace_test.c
# Opt level: O1

int main(void)

{
  _mpp_log_l(4,"mpp_trace_test","mpp trace test start\n",0);
  mpp_trace_begin("mpp_trace_test");
  mpp_trace_end("mpp_trace_test");
  mpp_trace_async_begin("mpp_trace_test async",10);
  mpp_trace_async_end("mpp_trace_test async",10);
  mpp_trace_int32("mpp_trace_test int32",0x100);
  mpp_trace_int64("mpp_trace_test int64",100000000);
  _mpp_log_l(4,"mpp_trace_test","mpp trace test done\n",0);
  return 0;
}

Assistant:

int main(void)
{
    mpp_log("mpp trace test start\n");

    mpp_trace_begin("mpp_trace_test");
    mpp_trace_end("mpp_trace_test");

    mpp_trace_async_begin("mpp_trace_test async", 10);
    mpp_trace_async_end("mpp_trace_test async", 10);

    mpp_trace_int32("mpp_trace_test int32", 256);
    mpp_trace_int64("mpp_trace_test int64", 100000000);

    mpp_log("mpp trace test done\n");

    return 0;
}